

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tai_pack.c
# Opt level: O0

void tai_pack(char *s,tai *t)

{
  uint64 uVar1;
  uint64 x;
  tai *t_local;
  char *s_local;
  
  uVar1 = t->x;
  s[7] = (char)uVar1;
  s[6] = (char)(uVar1 >> 8);
  s[5] = (char)(uVar1 >> 0x10);
  s[4] = (char)(uVar1 >> 0x18);
  s[3] = (char)(uVar1 >> 0x20);
  s[2] = (char)(uVar1 >> 0x28);
  s[1] = (char)(uVar1 >> 0x30);
  *s = (char)(uVar1 >> 0x38);
  return;
}

Assistant:

void tai_pack(char *s,const struct tai *t)
{
  uint64 x;

  x = t->x;
  s[7] = x & 255; x >>= 8;
  s[6] = x & 255; x >>= 8;
  s[5] = x & 255; x >>= 8;
  s[4] = x & 255; x >>= 8;
  s[3] = x & 255; x >>= 8;
  s[2] = x & 255; x >>= 8;
  s[1] = x & 255; x >>= 8;
  s[0] = x;
}